

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmVariableWatchCommand.cxx
# Opt level: O1

void anon_unknown.dwarf_1953bff::cmVariableWatchCommandVariableAccessed
               (string *variable,int access_type,void *client_data,char *newValue,cmMakefile *mf)

{
  uint *puVar1;
  pointer pcVar2;
  size_type sVar3;
  bool bVar4;
  string *psVar5;
  size_t sVar6;
  char *pcVar7;
  long lVar8;
  long *plVar9;
  initializer_list<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>
  views;
  initializer_list<cmListFileArgument> __l;
  initializer_list<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>
  views_00;
  string accessString;
  string stack;
  vector<cmListFileArgument,_std::allocator<cmListFileArgument>_> newLFFArgs;
  cmListFileFunction newLFF;
  cmExecutionStatus status;
  undefined1 local_301;
  uint *local_300;
  char *local_2f8;
  uint local_2f0;
  undefined4 uStack_2ec;
  undefined4 uStack_2e8;
  undefined4 uStack_2e4;
  pointer *local_2e0;
  pointer local_2d8;
  undefined1 local_2d0;
  undefined7 uStack_2cf;
  pointer pbStack_2c8;
  uint *local_2c0;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_2b8;
  uint local_2b0;
  undefined4 uStack_2ac;
  undefined4 uStack_2a8;
  undefined4 uStack_2a4;
  undefined1 *local_2a0;
  long *local_298;
  undefined8 local_290;
  undefined1 local_288;
  undefined7 uStack_287;
  undefined8 uStack_280;
  uint *local_278;
  char *local_270;
  uint local_268;
  undefined4 uStack_264;
  undefined4 uStack_260;
  undefined4 uStack_25c;
  long *local_258;
  pointer local_250;
  long local_248 [2];
  long *local_238;
  long local_230;
  long local_228 [2];
  vector<cmListFileArgument,_std::allocator<cmListFileArgument>_> local_218;
  cmMakefile *local_200;
  cmListFileFunction local_1f8;
  string local_1e8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1c8;
  undefined1 local_1a8 [24];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  aStack_190;
  ulong local_180;
  pointer *local_178;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_170;
  long *local_158;
  undefined8 local_150;
  uint *local_148;
  char *local_140;
  uint local_138 [2];
  undefined8 uStack_130;
  char *local_128;
  undefined8 local_120;
  uint *local_118;
  char *local_110;
  uint local_108 [3];
  undefined4 uStack_fc;
  undefined4 local_f8;
  undefined8 local_f0;
  long *local_e8;
  undefined8 local_e0;
  long local_d8;
  undefined8 uStack_d0;
  undefined4 local_c8;
  undefined8 local_c0;
  _Storage<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false>
  local_b8;
  bool local_98;
  vector<cmListFileArgument,_std::allocator<cmListFileArgument>_> local_90;
  string local_78;
  undefined8 local_58;
  undefined8 local_50;
  undefined8 local_48;
  char *local_40;
  undefined8 local_38;
  
  if (*client_data == '\0') {
    *(undefined1 *)client_data = 1;
    psVar5 = cmVariableWatch::GetAccessAsString_abi_cxx11_(access_type);
    local_258 = local_248;
    pcVar2 = (psVar5->_M_dataplus)._M_p;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_258,pcVar2,pcVar2 + psVar5->_M_string_length);
    puVar1 = (uint *)(local_1a8 + 0x10);
    local_1a8._0_8_ = puVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_1a8,"LISTFILE_STACK","");
    psVar5 = (string *)cmMakefile::GetProperty(mf,(string *)local_1a8);
    if (psVar5 == (string *)0x0) {
      psVar5 = &cmValue::Empty_abi_cxx11_;
    }
    local_238 = local_228;
    pcVar2 = (psVar5->_M_dataplus)._M_p;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_238,pcVar2,pcVar2 + psVar5->_M_string_length);
    if ((uint *)local_1a8._0_8_ != puVar1) {
      operator_delete((void *)local_1a8._0_8_,local_1a8._16_8_ + 1);
    }
    if (*(long *)((long)client_data + 0x10) == 0) {
      pcVar7 = "";
      if (newValue != (char *)0x0) {
        pcVar7 = newValue;
      }
      local_1a8._0_8_ = (cmMakefile *)0xa;
      local_1a8._8_8_ = "Variable \"";
      local_1a8._16_8_ = 0;
      pcVar2 = (variable->_M_dataplus)._M_p;
      sVar3 = variable->_M_string_length;
      aStack_190._0_4_ = (undefined4)sVar3;
      aStack_190._4_2_ = (undefined2)(sVar3 >> 0x20);
      aStack_190._6_2_ = (undefined2)(sVar3 >> 0x30);
      aStack_190._8_4_ = SUB84(pcVar2,0);
      aStack_190._12_2_ = (undefined2)((ulong)pcVar2 >> 0x20);
      aStack_190._M_local_buf[0xe] = (char)((ulong)pcVar2 >> 0x30);
      aStack_190._M_local_buf[0xf] = (char)((ulong)pcVar2 >> 0x38);
      local_180 = 0;
      local_178 = (pointer *)0x15;
      local_170.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x8d310c;
      local_170.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      local_170.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = local_250;
      local_158 = local_258;
      local_150 = 0;
      local_148 = (uint *)0xd;
      local_140 = " with value \"";
      local_138[0] = 0;
      local_138[1] = 0;
      uStack_130 = strlen(pcVar7);
      local_120 = 0;
      local_118 = (uint *)0x2;
      local_110 = "\".";
      local_108[0] = 0;
      local_108[1] = 0;
      views._M_len = 7;
      views._M_array = (iterator)local_1a8;
      local_128 = pcVar7;
      cmCatViews(&local_78,views);
      cmMakefile::IssueMessage(mf,LOG,&local_78);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_78._M_dataplus._M_p != &local_78.field_2) {
        operator_delete(local_78._M_dataplus._M_p,local_78.field_2._M_allocated_capacity + 1);
      }
    }
    else {
      local_1a8._0_8_ = puVar1;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_1a8,"CMAKE_CURRENT_LIST_FILE","");
      local_2a0 = (undefined1 *)client_data;
      psVar5 = (string *)cmMakefile::GetDefinition(mf,(string *)local_1a8);
      if ((uint *)local_1a8._0_8_ != puVar1) {
        operator_delete((void *)local_1a8._0_8_,local_1a8._16_8_ + 1);
      }
      pcVar2 = (variable->_M_dataplus)._M_p;
      local_2c0 = &local_2b0;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_2c0,pcVar2,pcVar2 + variable->_M_string_length);
      if (local_2c0 == &local_2b0) {
        aStack_190._0_4_ = uStack_2a8;
        aStack_190._4_2_ = (undefined2)uStack_2a4;
        aStack_190._6_2_ = (undefined2)((uint)uStack_2a4 >> 0x10);
        local_1a8._0_8_ = puVar1;
      }
      else {
        local_1a8._0_8_ = local_2c0;
      }
      local_1a8._8_8_ = local_2b8;
      local_2b8 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      local_2b0 = local_2b0 & 0xffffff00;
      aStack_190._8_4_ = Quoted;
      local_180 = 0x7fffffffffffffff;
      local_2e0 = (pointer *)&local_2d0;
      local_2c0 = &local_2b0;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_2e0,local_258,
                 (long)&(local_250->_M_dataplus)._M_p + (long)local_258);
      client_data = local_2a0;
      local_178 = &local_170.
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish;
      if (local_2e0 == (pointer *)&local_2d0) {
        local_170.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage = pbStack_2c8;
      }
      else {
        local_178 = local_2e0;
      }
      local_170.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = local_2d8;
      local_2d8 = (pointer)0x0;
      local_2d0 = 0;
      local_158 = (long *)CONCAT44(local_158._4_4_,1);
      local_150 = 0x7fffffffffffffff;
      pcVar7 = "";
      if (newValue != (char *)0x0) {
        pcVar7 = newValue;
      }
      local_300 = &local_2f0;
      local_2e0 = (pointer *)&local_2d0;
      local_200 = mf;
      sVar6 = strlen(pcVar7);
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_300,pcVar7,pcVar7 + sVar6);
      local_148 = local_138;
      if (local_300 == &local_2f0) {
        uStack_130 = CONCAT44(uStack_2e4,uStack_2e8);
      }
      else {
        local_148 = local_300;
      }
      local_138[1] = uStack_2ec;
      local_138[0] = local_2f0;
      local_140 = local_2f8;
      local_2f8 = (char *)0x0;
      local_2f0 = local_2f0 & 0xffffff00;
      local_128 = (char *)CONCAT44(local_128._4_4_,1);
      local_120 = 0x7fffffffffffffff;
      if (psVar5 == (string *)0x0) {
        psVar5 = &cmValue::Empty_abi_cxx11_;
      }
      pcVar2 = (psVar5->_M_dataplus)._M_p;
      local_300 = &local_2f0;
      local_278 = &local_268;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_278,pcVar2,pcVar2 + psVar5->_M_string_length);
      local_118 = local_108;
      if (local_278 == &local_268) {
        local_108[2] = uStack_260;
        uStack_fc = uStack_25c;
      }
      else {
        local_118 = local_278;
      }
      local_108[1] = uStack_264;
      local_108[0] = local_268;
      local_110 = local_270;
      local_270 = (char *)0x0;
      local_268 = local_268 & 0xffffff00;
      local_f8 = 1;
      local_f0 = 0x7fffffffffffffff;
      local_298 = (long *)&local_288;
      local_278 = &local_268;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_298,local_238,local_230 + (long)local_238);
      plVar9 = &local_d8;
      if (local_298 == (long *)&local_288) {
        uStack_d0 = uStack_280;
        local_e8 = plVar9;
      }
      else {
        local_e8 = local_298;
      }
      local_e0 = local_290;
      local_290 = 0;
      local_288 = 0;
      local_c8 = 1;
      local_c0 = 0x7fffffffffffffff;
      __l._M_len = 5;
      __l._M_array = (iterator)local_1a8;
      local_298 = (long *)&local_288;
      std::vector<cmListFileArgument,_std::allocator<cmListFileArgument>_>::vector
                (&local_218,__l,(allocator_type *)&local_78);
      lVar8 = -0xf0;
      do {
        if (plVar9 != (long *)plVar9[-2]) {
          operator_delete((long *)plVar9[-2],*plVar9 + 1);
        }
        plVar9 = plVar9 + -6;
        lVar8 = lVar8 + 0x30;
      } while (lVar8 != 0);
      if (local_298 != (long *)&local_288) {
        operator_delete(local_298,CONCAT71(uStack_287,local_288) + 1);
      }
      if (local_278 != &local_268) {
        operator_delete(local_278,CONCAT44(uStack_264,local_268) + 1);
      }
      if (local_300 != &local_2f0) {
        operator_delete(local_300,CONCAT44(uStack_2ec,local_2f0) + 1);
      }
      if (local_2e0 != (pointer *)&local_2d0) {
        operator_delete(local_2e0,CONCAT71(uStack_2cf,local_2d0) + 1);
      }
      if (local_2c0 != &local_2b0) {
        operator_delete(local_2c0,CONCAT44(uStack_2ac,local_2b0) + 1);
      }
      local_1c8._M_dataplus._M_p = (pointer)&local_1c8.field_2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_1c8,*(long *)((long)client_data + 8),
                 *(long *)((long)client_data + 0x10) + *(long *)((long)client_data + 8));
      local_90.super__Vector_base<cmListFileArgument,_std::allocator<cmListFileArgument>_>._M_impl.
      super__Vector_impl_data._M_start =
           local_218.super__Vector_base<cmListFileArgument,_std::allocator<cmListFileArgument>_>.
           _M_impl.super__Vector_impl_data._M_start;
      local_90.super__Vector_base<cmListFileArgument,_std::allocator<cmListFileArgument>_>._M_impl.
      super__Vector_impl_data._M_finish =
           local_218.super__Vector_base<cmListFileArgument,_std::allocator<cmListFileArgument>_>.
           _M_impl.super__Vector_impl_data._M_finish;
      local_90.super__Vector_base<cmListFileArgument,_std::allocator<cmListFileArgument>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage =
           local_218.super__Vector_base<cmListFileArgument,_std::allocator<cmListFileArgument>_>.
           _M_impl.super__Vector_impl_data._M_end_of_storage;
      local_218.super__Vector_base<cmListFileArgument,_std::allocator<cmListFileArgument>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      local_218.super__Vector_base<cmListFileArgument,_std::allocator<cmListFileArgument>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      local_218.super__Vector_base<cmListFileArgument,_std::allocator<cmListFileArgument>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      local_78._M_dataplus._M_p = (pointer)0x7fffffffffffffff;
      local_1e8._M_dataplus._M_p = (pointer)0x7fffffffffffffff;
      local_1a8._0_8_ = (pointer)0x0;
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
      __shared_count<cmListFileFunction::Implementation,std::allocator<cmListFileFunction::Implementation>,std::__cxx11::string,long&,long&,std::vector<cmListFileArgument,std::allocator<cmListFileArgument>>>
                ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_1a8 + 8),
                 (Implementation **)local_1a8,
                 (allocator<cmListFileFunction::Implementation> *)&local_301,&local_1c8,
                 (long *)&local_78,(long *)&local_1e8,&local_90);
      local_1f8.Impl.
      super___shared_ptr<const_cmListFileFunction::Implementation,_(__gnu_cxx::_Lock_policy)2>.
      _M_ptr = (element_type *)local_1a8._0_8_;
      local_1f8.Impl.
      super___shared_ptr<const_cmListFileFunction::Implementation,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_1a8._8_8_;
      std::vector<cmListFileArgument,_std::allocator<cmListFileArgument>_>::~vector(&local_90);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1c8._M_dataplus._M_p != &local_1c8.field_2) {
        operator_delete(local_1c8._M_dataplus._M_p,local_1c8.field_2._M_allocated_capacity + 1);
      }
      local_1a8._0_8_ = local_200;
      aStack_190._0_4_ = 0x6e6b6e75;
      aStack_190._4_2_ = 0x776f;
      aStack_190._6_2_ = 0x206e;
      aStack_190._8_4_ = 0x6f727265;
      aStack_190._12_2_ = 0x2e72;
      local_1a8._16_8_ = 0xe;
      aStack_190._M_local_buf[0xe] = '\0';
      local_178 = (pointer *)((ulong)local_178 & 0xffffffffffffff00);
      local_170.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      local_170.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      local_170.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      local_180 = local_180 & 0xffffffff00000000;
      local_98 = false;
      local_1a8._8_8_ = &aStack_190;
      bVar4 = cmMakefile::ExecuteCommand
                        (local_200,&local_1f8,(cmExecutionStatus *)local_1a8,
                         (optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                          *)&local_b8);
      if (local_98 == true) {
        local_98 = false;
        if (local_b8._M_value._M_dataplus._M_p != (_Alloc_hider)((long)&local_b8._M_value + 0x10)) {
          operator_delete((void *)local_b8._M_value._M_dataplus._M_p,local_b8._16_8_ + 1);
        }
      }
      if (!bVar4) {
        local_78._M_dataplus._M_p = (pointer)0x56;
        local_78._M_string_length = 0x8d30aa;
        local_78.field_2._M_allocated_capacity = 0;
        local_58 = *(undefined8 *)((long)client_data + 8);
        local_78.field_2._8_8_ = *(undefined8 *)((long)client_data + 0x10);
        local_50 = 0;
        local_48 = 2;
        local_40 = "\".";
        local_38 = 0;
        views_00._M_len = 3;
        views_00._M_array = (iterator)&local_78;
        cmCatViews(&local_1e8,views_00);
        cmSystemTools::Error(&local_1e8);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1e8._M_dataplus._M_p != &local_1e8.field_2) {
          operator_delete(local_1e8._M_dataplus._M_p,local_1e8.field_2._M_allocated_capacity + 1);
        }
      }
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&local_170);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1a8._8_8_ != &aStack_190) {
        operator_delete((void *)local_1a8._8_8_,
                        CONCAT26(aStack_190._6_2_,CONCAT24(aStack_190._4_2_,aStack_190._0_4_)) + 1);
      }
      if (local_1f8.Impl.
          super___shared_ptr<const_cmListFileFunction::Implementation,_(__gnu_cxx::_Lock_policy)2>.
          _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  (local_1f8.Impl.
                   super___shared_ptr<const_cmListFileFunction::Implementation,_(__gnu_cxx::_Lock_policy)2>
                   ._M_refcount._M_pi);
      }
      std::vector<cmListFileArgument,_std::allocator<cmListFileArgument>_>::~vector(&local_218);
    }
    *(undefined1 *)client_data = 0;
    if (local_238 != local_228) {
      operator_delete(local_238,local_228[0] + 1);
    }
    if (local_258 != local_248) {
      operator_delete(local_258,local_248[0] + 1);
    }
  }
  return;
}

Assistant:

void cmVariableWatchCommandVariableAccessed(const std::string& variable,
                                            int access_type, void* client_data,
                                            const char* newValue,
                                            const cmMakefile* mf)
{
  cmVariableWatchCallbackData* data =
    static_cast<cmVariableWatchCallbackData*>(client_data);

  if (data->InCallback) {
    return;
  }
  data->InCallback = true;

  auto accessString = cmVariableWatch::GetAccessAsString(access_type);

  /// Ultra bad!!
  cmMakefile* makefile = const_cast<cmMakefile*>(mf);

  std::string stack = *mf->GetProperty("LISTFILE_STACK");
  if (!data->Command.empty()) {
    cmValue const currentListFile =
      mf->GetDefinition("CMAKE_CURRENT_LIST_FILE");
    const auto fakeLineNo =
      std::numeric_limits<decltype(cmListFileArgument::Line)>::max();

    std::vector<cmListFileArgument> newLFFArgs{
      { variable, cmListFileArgument::Quoted, fakeLineNo },
      { accessString, cmListFileArgument::Quoted, fakeLineNo },
      { newValue ? newValue : "", cmListFileArgument::Quoted, fakeLineNo },
      { *currentListFile, cmListFileArgument::Quoted, fakeLineNo },
      { stack, cmListFileArgument::Quoted, fakeLineNo }
    };

    cmListFileFunction newLFF{ data->Command, fakeLineNo, fakeLineNo,
                               std::move(newLFFArgs) };
    cmExecutionStatus status(*makefile);
    if (!makefile->ExecuteCommand(newLFF, status)) {
      cmSystemTools::Error(
        cmStrCat("Error in cmake code at\nUnknown:0:\nA command failed "
                 "during the invocation of callback \"",
                 data->Command, "\"."));
    }
  } else {
    makefile->IssueMessage(
      MessageType::LOG,
      cmStrCat("Variable \"", variable, "\" was accessed using ", accessString,
               " with value \"", (newValue ? newValue : ""), "\"."));
  }

  data->InCallback = false;
}